

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v7::detail::fallback_format<double>
               (double d,int num_digits,bool binary32,buffer<char> *buf,int *exp10)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  char *pcVar5;
  size_t sVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  undefined7 in_register_00000031;
  byte bVar12;
  long lVar13;
  ulong uVar14;
  bigint *lhs2;
  ulong uVar15;
  uint64_t value;
  bool bVar16;
  bool bVar17;
  float fVar18;
  bigint numerator;
  bigint denominator;
  bigint lower;
  bigint upper_store;
  bigint *local_338;
  bigint local_2f0;
  bigint local_240;
  bigint local_190;
  bigint local_e0;
  
  local_2f0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001d0818;
  puVar1 = local_2f0.bigits_.store_;
  local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_2f0.exp_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001d0818;
  puVar2 = local_240.bigits_.store_;
  local_240.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_240.exp_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001d0818;
  puVar3 = local_190.bigits_.store_;
  local_190.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_190.exp_ = 0;
  local_338 = &local_e0;
  local_e0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_e0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001d0818;
  puVar4 = local_e0.bigits_.store_;
  local_e0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_e0.exp_ = 0;
  if ((int)CONCAT71(in_register_00000031,binary32) == 0) {
    uVar14 = (ulong)d & 0xfffffffffffff;
    uVar10 = (uint)((ulong)d >> 0x34) & 0x7ff;
    uVar15 = uVar14 + 0x10000000000000;
    if (uVar10 == 0) {
      uVar15 = uVar14;
    }
    iVar8 = -0x432;
    if (uVar10 != 0) {
      iVar8 = uVar10 - 0x433;
    }
    bVar17 = uVar14 == 0;
    bVar16 = uVar10 < 2;
  }
  else {
    fVar18 = (float)d;
    uVar10 = (uint)fVar18 & 0x7fffff;
    uVar15 = (ulong)uVar10 + 0x800000;
    if ((uint)fVar18 < 0x800000) {
      uVar15 = (ulong)uVar10;
    }
    iVar8 = -0x95;
    if ((uint)fVar18 >= 0x800000) {
      iVar8 = ((uint)fVar18 >> 0x17) - 0x96;
    }
    bVar17 = uVar10 == 0;
    bVar16 = (uint)fVar18 < 0x1000000;
  }
  bVar12 = !bVar16 & bVar17;
  iVar11 = bVar12 + 1;
  value = uVar15 << (sbyte)iVar11;
  local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ = puVar1;
  local_240.bigits_.super_buffer<unsigned_int>.ptr_ = puVar2;
  local_190.bigits_.super_buffer<unsigned_int>.ptr_ = puVar3;
  local_e0.bigits_.super_buffer<unsigned_int>.ptr_ = puVar4;
  if (iVar8 < 0) {
    if (*exp10 < 0) {
      bigint::assign_pow10(&local_2f0,-*exp10);
      sVar6 = local_2f0.bigits_.super_buffer<unsigned_int>.size_;
      if (local_190.bigits_.super_buffer<unsigned_int>.capacity_ <
          local_2f0.bigits_.super_buffer<unsigned_int>.size_) {
        (**local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer)
                  (&local_190,local_2f0.bigits_.super_buffer<unsigned_int>.size_);
      }
      local_190.bigits_.super_buffer<unsigned_int>.size_ =
           local_190.bigits_.super_buffer<unsigned_int>.capacity_;
      if (sVar6 <= local_190.bigits_.super_buffer<unsigned_int>.capacity_) {
        local_190.bigits_.super_buffer<unsigned_int>.size_ = sVar6;
      }
      if (sVar6 != 0) {
        memmove(local_190.bigits_.super_buffer<unsigned_int>.ptr_,
                local_2f0.bigits_.super_buffer<unsigned_int>.ptr_,sVar6 << 2);
      }
      sVar6 = local_2f0.bigits_.super_buffer<unsigned_int>.size_;
      local_190.exp_ = local_2f0.exp_;
      if (bVar12 == 0) {
        local_338 = (bigint *)0x0;
      }
      else {
        if (local_e0.bigits_.super_buffer<unsigned_int>.capacity_ <
            local_2f0.bigits_.super_buffer<unsigned_int>.size_) {
          (**local_e0.bigits_.super_buffer<unsigned_int>._vptr_buffer)
                    (&local_e0,local_2f0.bigits_.super_buffer<unsigned_int>.size_);
        }
        local_e0.bigits_.super_buffer<unsigned_int>.size_ =
             local_e0.bigits_.super_buffer<unsigned_int>.capacity_;
        if (sVar6 <= local_e0.bigits_.super_buffer<unsigned_int>.capacity_) {
          local_e0.bigits_.super_buffer<unsigned_int>.size_ = sVar6;
        }
        if (sVar6 != 0) {
          memmove(local_e0.bigits_.super_buffer<unsigned_int>.ptr_,
                  local_2f0.bigits_.super_buffer<unsigned_int>.ptr_,sVar6 << 2);
        }
        local_338 = &local_e0;
        local_e0.exp_ = local_2f0.exp_;
        bigint::operator<<=(local_338,1);
      }
      bigint::multiply(&local_2f0,value);
      bigint::assign(&local_240,1);
      bigint::operator<<=(&local_240,iVar11 - iVar8);
    }
    else {
      bigint::assign(&local_2f0,value);
      bigint::assign_pow10(&local_240,*exp10);
      bigint::operator<<=(&local_240,iVar11 - iVar8);
      bigint::assign(&local_190,1);
      if (bVar12 == 0) {
        local_338 = (bigint *)0x0;
      }
      else {
        bigint::assign(&local_e0,2);
      }
    }
  }
  else {
    bigint::assign(&local_2f0,value);
    bigint::operator<<=(&local_2f0,iVar8);
    bigint::assign(&local_190,1);
    bigint::operator<<=(&local_190,iVar8);
    if (bVar12 == 0) {
      local_338 = (bigint *)0x0;
    }
    else {
      local_338 = &local_e0;
      bigint::assign(local_338,1);
      bigint::operator<<=(&local_e0,iVar8 + 1);
    }
    bigint::assign_pow10(&local_240,*exp10);
    bigint::operator<<=(&local_240,iVar11);
  }
  if (-1 < num_digits) {
    *exp10 = *exp10 - (num_digits + -1);
    uVar10 = num_digits - 1;
    if (num_digits == 0) {
      if (buf->capacity_ == 0) {
        (**buf->_vptr_buffer)(buf,1);
      }
      buf->size_ = (ulong)(buf->capacity_ != 0);
      bigint::multiply(&local_240,10);
      iVar8 = add_compare(&local_2f0,&local_2f0,&local_240);
      *buf->ptr_ = 0 < iVar8 | 0x30;
    }
    else {
      uVar15 = (ulong)(uint)num_digits;
      if (buf->capacity_ < uVar15) {
        (**buf->_vptr_buffer)(buf,uVar15);
      }
      uVar14 = buf->capacity_;
      if (uVar15 <= buf->capacity_) {
        uVar14 = uVar15;
      }
      buf->size_ = uVar14;
      if (1 < num_digits) {
        uVar14 = 0;
        do {
          iVar8 = bigint::divmod_assign(&local_2f0,&local_240);
          buf->ptr_[uVar14] = (char)iVar8 + '0';
          bigint::multiply(&local_2f0,10);
          uVar14 = uVar14 + 1;
        } while (uVar10 != uVar14);
      }
      uVar9 = bigint::divmod_assign(&local_2f0,&local_240);
      iVar8 = add_compare(&local_2f0,&local_2f0,&local_240);
      if ((0 < iVar8) || ((uVar9 & 1) != 0 && iVar8 == 0)) {
        if (uVar9 == 9) {
          buf->ptr_[(int)uVar10] = ':';
          if (1 < num_digits) {
            do {
              if (buf->ptr_[uVar15 - 1] != ':') break;
              buf->ptr_[uVar15 - 1] = '0';
              buf->ptr_[uVar15 - 2] = buf->ptr_[uVar15 - 2] + '\x01';
              uVar15 = uVar15 - 1;
            } while (1 < (long)uVar15);
          }
          if (*buf->ptr_ == ':') {
            *buf->ptr_ = '1';
            *exp10 = *exp10 + 1;
          }
          goto LAB_001683c8;
        }
        uVar9 = uVar9 + 1;
      }
      buf->ptr_[(int)uVar10] = (char)uVar9 + '0';
    }
    goto LAB_001683c8;
  }
  lhs2 = local_338;
  if (local_338 == (bigint *)0x0) {
    lhs2 = &local_190;
  }
  pcVar5 = buf->ptr_;
  uVar10 = ~(uint)uVar15 & 1;
  lVar13 = 0;
  while( true ) {
    uVar9 = bigint::divmod_assign(&local_2f0,&local_240);
    iVar8 = compare(&local_2f0,&local_190);
    iVar11 = add_compare(&local_2f0,lhs2,&local_240);
    pcVar5[lVar13] = (char)uVar9 + '0';
    if ((iVar8 < (int)uVar10) || ((int)-uVar10 < iVar11)) break;
    bigint::multiply(&local_2f0,10);
    bigint::multiply(&local_190,10);
    if (local_338 != (bigint *)0x0) {
      bigint::multiply(lhs2,10);
    }
    lVar13 = lVar13 + 1;
  }
  if (iVar8 < (int)uVar10) {
    if ((int)-uVar10 < iVar11) {
      iVar8 = add_compare(&local_2f0,&local_2f0,&local_240);
      if ((0 < iVar8) || ((uVar9 & 1) != 0 && iVar8 == 0)) {
        cVar7 = pcVar5[lVar13] + '\x01';
        goto LAB_0016827f;
      }
    }
  }
  else {
    cVar7 = (char)uVar9 + '1';
LAB_0016827f:
    pcVar5[lVar13] = cVar7;
  }
  uVar15 = lVar13 + 1U & 0xffffffff;
  if (buf->capacity_ < uVar15) {
    (**buf->_vptr_buffer)(buf,uVar15);
  }
  if (buf->capacity_ < uVar15) {
    uVar15 = buf->capacity_;
  }
  buf->size_ = uVar15;
  *exp10 = *exp10 - (int)lVar13;
LAB_001683c8:
  if (local_e0.bigits_.super_buffer<unsigned_int>.ptr_ != puVar4) {
    operator_delete(local_e0.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_e0.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  if (local_190.bigits_.super_buffer<unsigned_int>.ptr_ != puVar3) {
    operator_delete(local_190.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_190.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  if (local_240.bigits_.super_buffer<unsigned_int>.ptr_ != puVar2) {
    operator_delete(local_240.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_240.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  if (local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ != puVar1) {
    operator_delete(local_2f0.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  return;
}

Assistant:

void fallback_format(Double d, int num_digits, bool binary32, buffer<char>& buf,
                     int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  const bool is_predecessor_closer =
      binary32 ? value.assign(static_cast<float>(d)) : value.assign(d);
  int shift = is_predecessor_closer ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (num_digits < 0) {
    // Generate the shortest representation.
    if (!upper) upper = &lower;
    bool even = (value.f & 1) == 0;
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits == 0) {
    buf.try_resize(1);
    denominator *= 10;
    buf[0] = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}